

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O3

void * fs_create_serializer
                 (char *directory,int directory_length,char *prefix,int prefix_length,char openmode)

{
  Serializer *this;
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  SerializerOpenMode mode;
  string prefix_str;
  string directory_str;
  char local_69;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,directory,directory + directory_length);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,prefix,prefix + prefix_length)
  ;
  if (openmode == 'a') {
    mode = SerializerOpenModeAppend;
  }
  else {
    mode = SerializerOpenModeRead;
    if (openmode != 'r') {
      if (openmode != 'w') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: openmode \"",0x11);
        local_69 = openmode;
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,&local_69,1);
        std::operator<<(poVar2,"\" not supported\n");
        exit(-1);
      }
      mode = SerializerOpenModeWrite;
    }
  }
  this = (Serializer *)operator_new(0xe8);
  this->_vptr_Serializer = (_func_int **)&PTR__Serializer_0018fb88;
  p_Var1 = &(this->globalMetainfo_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->globalMetainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->globalMetainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->globalMetainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->globalMetainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->globalMetainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fieldsTable_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->fieldsTable_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fieldsTable_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->fieldsTable_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fieldsTable_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->offsetTable_).savepointIndex_._M_t._M_impl.super__Rb_tree_header;
  (this->offsetTable_).savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->offsetTable_).savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fieldsTable_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->offsetTable_).savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsetTable_).savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsetTable_).savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offsetTable_).entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsetTable_).entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsetTable_).entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offsetTable_).savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->offsetTable_).savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->pFileFormat_).pn.pi_ = (sp_counted_base *)0x0;
  (this->offsetTable_).savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->pFileFormat_).px = (element_type *)0x0;
  ser::Serializer::Init(this,&local_48,&local_68,mode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return this;
}

Assistant:

void* fs_create_serializer(const char* directory, int directory_length,
                           const char* prefix, int prefix_length,
                           char openmode)
{
    std::string directory_str(directory, directory_length);
    std::string prefix_str(prefix, prefix_length);

    SerializerOpenMode mode;
    switch(openmode)
    {
        case 'r':
            mode = SerializerOpenModeRead;
            break;
        case 'w':
            mode = SerializerOpenModeWrite;
            break;
        case 'a':
            mode = SerializerOpenModeAppend;
            break;
        default:
            std::cerr << "Error: openmode \"" << openmode << "\" not supported\n";
            std::exit(-1);
    }

    // Create serializer
    Serializer* pSerializer = new Serializer;
    pSerializer->Init(directory_str, prefix_str, mode);

    return reinterpret_cast<void*>(pSerializer);
}